

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-common.cpp
# Opt level: O0

string * __thiscall Dashel::ParameterSet::get_abi_cxx11_(ParameterSet *this,char *key)

{
  bool bVar1;
  string *psVar2;
  DashelException *this_00;
  char *reason;
  pointer ppVar3;
  allocator<char> local_a1;
  string local_a0 [32];
  string local_80 [8];
  string r;
  allocator<char> local_41;
  key_type local_40;
  _Self local_20;
  const_iterator it;
  char *key_local;
  ParameterSet *this_local;
  
  it._M_node = (_Base_ptr)key;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,key,&local_41);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->values,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  r.field_2._8_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->values);
  bVar1 = std::operator==(&local_20,(_Self *)((long)&r.field_2 + 8));
  if (!bVar1) {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_20);
    return &ppVar3->second;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"Parameter missing: ",&local_a1);
  psVar2 = (string *)std::__cxx11::string::append((char *)local_a0);
  std::__cxx11::string::string(local_80,psVar2);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  this_00 = (DashelException *)__cxa_allocate_exception(0x20);
  reason = (char *)std::__cxx11::string::c_str();
  DashelException::DashelException(this_00,InvalidTarget,0,reason,(Stream *)0x0);
  __cxa_throw(this_00,&DashelException::typeinfo,DashelException::~DashelException);
}

Assistant:

const std::string& ParameterSet::get(const char* key) const
	{
		std::map<std::string, std::string>::const_iterator it = values.find(key);
		if (it == values.end())
		{
			std::string r = std::string("Parameter missing: ").append(key);
			throw DashelException(DashelException::InvalidTarget, 0, r.c_str());
		}
		return it->second;
	}